

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::insert_example
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,bool fake_insert)

{
  bool bVar1;
  uint cn;
  ulong uVar2;
  node *pnVar3;
  float fVar4;
  
  cn = 0;
  while( true ) {
    pnVar3 = (b->nodes)._begin;
    if (pnVar3[cn].internal != 1) break;
    fVar4 = train_node(b,base,(b->examples)._begin[*ec_array_index],cn);
    pnVar3 = (b->nodes)._begin;
    bVar1 = 0.0 <= fVar4;
    (&pnVar3[cn].nl)[bVar1] = (&pnVar3[cn].nl)[bVar1] + 1.0;
    cn = (&pnVar3[cn].left)[bVar1];
  }
  if (b->oas == 1) {
    train_one_against_some_at_leaf(b,base,cn,(b->examples)._begin[*ec_array_index]);
    pnVar3 = (b->nodes)._begin;
  }
  if (pnVar3[cn].internal == -1 && !fake_insert) {
    v_array<unsigned_int>::push_back(&pnVar3[cn].examples_index,ec_array_index);
    pnVar3 = (b->nodes)._begin;
    uVar2 = (long)pnVar3[cn].examples_index._end - (long)pnVar3[cn].examples_index._begin >> 2;
    if (b->max_ex_in_leaf < uVar2) {
      b->max_ex_in_leaf = uVar2;
    }
    fVar4 = train_node(b,base,(b->examples)._begin[*ec_array_index],cn);
    pnVar3 = (b->nodes)._begin;
    (&pnVar3[cn].nl)[0.0 <= fVar4] = (&pnVar3[cn].nl)[0.0 <= fVar4] + 1.0;
    pnVar3 = (b->nodes)._begin;
    if ((b->max_leaf_examples <=
         (ulong)((long)pnVar3[cn].examples_index._end - (long)pnVar3[cn].examples_index._begin >> 2)
        ) && (((long)(b->nodes)._end - (long)pnVar3) / 0x48 + 2U <= b->max_nodes)) {
      split_leaf(b,base,cn);
      return;
    }
  }
  return;
}

Assistant:

void insert_example(memory_tree& b, single_learner& base, const uint32_t& ec_array_index, bool fake_insert = false)
    {
        uint32_t cn = 0; //start from the root.
        while(b.nodes[cn].internal == 1) //if it's internal node:
        {   
            //predict and train the node at cn.
            float router_pred = train_node(b, base, *b.examples[ec_array_index], cn); 
            uint32_t newcn = insert_descent(b.nodes[cn], router_pred); //updated nr or nl
            cn = newcn; 
        }
    
        if (b.oas == true)  //if useing oas as inference procedure, we just train oas here, as it's independent of the memory unit anyway'
            train_one_against_some_at_leaf(b, base, cn, *b.examples[ec_array_index]);

        if((b.nodes[cn].internal == -1) && (fake_insert == false)) //get to leaf:
        {   
            b.nodes[cn].examples_index.push_back(ec_array_index);
            if (b.nodes[cn].examples_index.size() > b.max_ex_in_leaf)
            {
                b.max_ex_in_leaf = b.nodes[cn].examples_index.size();
            }
            float leaf_pred = train_node(b, base, *b.examples[ec_array_index], cn); //tain the leaf as well.
            insert_descent(b.nodes[cn], leaf_pred); //this is a faked descent, the purpose is only to update nl and nr of cn

            //if the number of examples exceeds the max_leaf_examples, and not reach the max_nodes - 2 yet, we split:
            if((b.nodes[cn].examples_index.size() >= b.max_leaf_examples) && (b.nodes.size() + 2 <= b.max_nodes)){
                split_leaf(b, base, cn); 
            }
        }
    }